

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O3

uint8 * __thiscall
caffe::V1LayerParameter::InternalSerializeWithCachedSizesToArray
          (V1LayerParameter *this,bool deterministic,uint8 *target)

{
  RepeatedPtrField<caffe::NetStateRule> *this_00;
  float fVar1;
  int iVar2;
  V0LayerParameter *this_01;
  char *pcVar3;
  string *psVar4;
  ConcatParameter *this_02;
  ConvolutionParameter *this_03;
  DataParameter *this_04;
  DropoutParameter *this_05;
  HDF5DataParameter *this_06;
  HDF5OutputParameter *this_07;
  ImageDataParameter *this_08;
  InfogainLossParameter *this_09;
  InnerProductParameter *this_10;
  LRNParameter *this_11;
  PoolingParameter *this_12;
  WindowDataParameter *this_13;
  PowerParameter *this_14;
  MemoryDataParameter *this_15;
  ArgMaxParameter *this_16;
  EltwiseParameter *this_17;
  ThresholdParameter *this_18;
  DummyDataParameter *this_19;
  AccuracyParameter *this_20;
  HingeLossParameter *this_21;
  ReLUParameter *this_22;
  SliceParameter *this_23;
  MVNParameter *this_24;
  TransformationParameter *this_25;
  TanHParameter *this_26;
  SigmoidParameter *this_27;
  SoftmaxParameter *this_28;
  ContrastiveLossParameter *this_29;
  ExpParameter *this_30;
  LossParameter *this_31;
  void *pvVar5;
  bool bVar6;
  V1LayerParameter *pVVar7;
  uint uVar8;
  uint uVar9;
  Type *pTVar10;
  Type *this_32;
  LogMessage *pLVar11;
  Type *pTVar12;
  Rep *pRVar13;
  uint uVar14;
  ulong uVar15;
  Rep *pRVar16;
  ulong uVar17;
  int iVar18;
  ulong uVar19;
  ulong uVar20;
  byte *pbVar21;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar22;
  LogFinisher local_79;
  V1LayerParameter *local_78;
  uint local_6c;
  LogMessage local_68;
  
  local_6c = (this->_has_bits_).has_bits_[0];
  if ((local_6c & 2) != 0) {
    this_01 = this->layer_;
    *target = '\n';
    pbVar21 = target + 1;
    uVar14 = this_01->_cached_size_;
    uVar8 = uVar14;
    if (0x7f < uVar14) {
      do {
        *pbVar21 = (byte)uVar14 | 0x80;
        uVar8 = uVar14 >> 7;
        pbVar21 = pbVar21 + 1;
        bVar6 = 0x3fff < uVar14;
        uVar14 = uVar8;
      } while (bVar6);
    }
    *pbVar21 = (byte)uVar8;
    target = V0LayerParameter::InternalSerializeWithCachedSizesToArray(this_01,false,pbVar21 + 1);
  }
  iVar2 = (this->bottom_).super_RepeatedPtrFieldBase.current_size_;
  local_78 = this;
  if (0 < iVar2) {
    pRVar22 = &this->bottom_;
    iVar18 = 0;
    do {
      pTVar10 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                          (&pRVar22->super_RepeatedPtrFieldBase,iVar18);
      pcVar3 = (pTVar10->_M_dataplus)._M_p;
      pTVar10 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                          (&pRVar22->super_RepeatedPtrFieldBase,iVar18);
      google::protobuf::internal::WireFormatLite::VerifyUtf8String
                (pcVar3,(int)pTVar10->_M_string_length,SERIALIZE,"caffe.V1LayerParameter.bottom");
      pTVar10 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                          (&pRVar22->super_RepeatedPtrFieldBase,iVar18);
      *target = 0x12;
      target = google::protobuf::io::CodedOutputStream::WriteStringWithSizeToArray
                         (pTVar10,target + 1);
      iVar18 = iVar18 + 1;
    } while (iVar2 != iVar18);
  }
  iVar2 = (local_78->top_).super_RepeatedPtrFieldBase.current_size_;
  if (0 < iVar2) {
    pRVar22 = &local_78->top_;
    iVar18 = 0;
    do {
      pTVar10 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                          (&pRVar22->super_RepeatedPtrFieldBase,iVar18);
      pcVar3 = (pTVar10->_M_dataplus)._M_p;
      pTVar10 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                          (&pRVar22->super_RepeatedPtrFieldBase,iVar18);
      google::protobuf::internal::WireFormatLite::VerifyUtf8String
                (pcVar3,(int)pTVar10->_M_string_length,SERIALIZE,"caffe.V1LayerParameter.top");
      pTVar10 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                          (&pRVar22->super_RepeatedPtrFieldBase,iVar18);
      *target = 0x1a;
      target = google::protobuf::io::CodedOutputStream::WriteStringWithSizeToArray
                         (pTVar10,target + 1);
      iVar18 = iVar18 + 1;
    } while (iVar2 != iVar18);
  }
  pVVar7 = local_78;
  if ((local_6c & 1) != 0) {
    psVar4 = (local_78->name_).ptr_;
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar4->_M_dataplus)._M_p,(int)psVar4->_M_string_length,SERIALIZE,
               "caffe.V1LayerParameter.name");
    psVar4 = (pVVar7->name_).ptr_;
    *target = 0x22;
    target = google::protobuf::io::CodedOutputStream::WriteStringWithSizeToArray(psVar4,target + 1);
  }
  if (((pVVar7->_has_bits_).has_bits_[1] & 1) != 0) {
    uVar15 = (ulong)pVVar7->type_;
    pbVar21 = target + 1;
    *target = 0x28;
    uVar17 = uVar15;
    if (0x7f < uVar15) {
      do {
        *pbVar21 = (byte)uVar15 | 0x80;
        uVar17 = uVar15 >> 7;
        pbVar21 = pbVar21 + 1;
        bVar6 = 0x3fff < uVar15;
        uVar15 = uVar17;
      } while (bVar6);
    }
    *pbVar21 = (byte)uVar17;
    target = pbVar21 + 1;
  }
  iVar2 = (pVVar7->blobs_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar2 != 0) {
    iVar18 = 0;
    do {
      this_32 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                          (&(pVVar7->blobs_).super_RepeatedPtrFieldBase,iVar18);
      *target = 0x32;
      pbVar21 = target + 1;
      uVar14 = this_32->_cached_size_;
      uVar8 = uVar14;
      if (0x7f < uVar14) {
        do {
          *pbVar21 = (byte)uVar14 | 0x80;
          uVar8 = uVar14 >> 7;
          pbVar21 = pbVar21 + 1;
          bVar6 = 0x3fff < uVar14;
          uVar14 = uVar8;
        } while (bVar6);
      }
      *pbVar21 = (byte)uVar8;
      target = BlobProto::InternalSerializeWithCachedSizesToArray(this_32,false,pbVar21 + 1);
      iVar18 = iVar18 + 1;
    } while (iVar18 != iVar2);
  }
  pVVar7 = local_78;
  uVar14 = (local_78->blobs_lr_).current_size_;
  if (uVar14 != 0) {
    pRVar13 = (local_78->blobs_lr_).rep_;
    if (pRVar13 == (Rep *)0x0) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x4e2);
      pLVar11 = google::protobuf::internal::LogMessage::operator<<(&local_68,"CHECK failed: rep_: ")
      ;
      google::protobuf::internal::LogFinisher::operator=(&local_79,pLVar11);
      google::protobuf::internal::LogMessage::~LogMessage(&local_68);
      pRVar13 = (pVVar7->blobs_lr_).rep_;
    }
    uVar15 = 1;
    if (1 < (int)uVar14) {
      uVar15 = (ulong)uVar14;
    }
    uVar17 = 0;
    do {
      fVar1 = pRVar13->elements[uVar17];
      *target = 0x3d;
      *(float *)(target + 1) = fVar1;
      target = target + 5;
      uVar17 = uVar17 + 1;
    } while (uVar15 != uVar17);
  }
  uVar14 = (pVVar7->weight_decay_).current_size_;
  if (uVar14 != 0) {
    pRVar13 = (pVVar7->weight_decay_).rep_;
    if (pRVar13 == (Rep *)0x0) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x4e2);
      pLVar11 = google::protobuf::internal::LogMessage::operator<<(&local_68,"CHECK failed: rep_: ")
      ;
      google::protobuf::internal::LogFinisher::operator=(&local_79,pLVar11);
      google::protobuf::internal::LogMessage::~LogMessage(&local_68);
      pRVar13 = (pVVar7->weight_decay_).rep_;
    }
    uVar15 = 1;
    if (1 < (int)uVar14) {
      uVar15 = (ulong)uVar14;
    }
    uVar17 = 0;
    do {
      fVar1 = pRVar13->elements[uVar17];
      *target = 0x45;
      *(float *)(target + 1) = fVar1;
      target = target + 5;
      uVar17 = uVar17 + 1;
    } while (uVar15 != uVar17);
  }
  uVar14 = (pVVar7->_has_bits_).has_bits_[0];
  if ((uVar14 & 4) != 0) {
    this_02 = pVVar7->concat_param_;
    *target = 0x4a;
    pbVar21 = target + 1;
    uVar8 = this_02->_cached_size_;
    uVar9 = uVar8;
    if (0x7f < uVar8) {
      do {
        *pbVar21 = (byte)uVar8 | 0x80;
        uVar9 = uVar8 >> 7;
        pbVar21 = pbVar21 + 1;
        bVar6 = 0x3fff < uVar8;
        uVar8 = uVar9;
      } while (bVar6);
    }
    *pbVar21 = (byte)uVar9;
    target = ConcatParameter::InternalSerializeWithCachedSizesToArray(this_02,false,pbVar21 + 1);
  }
  if ((uVar14 & 8) != 0) {
    this_03 = pVVar7->convolution_param_;
    *target = 0x52;
    pbVar21 = target + 1;
    uVar8 = this_03->_cached_size_;
    uVar9 = uVar8;
    if (0x7f < uVar8) {
      do {
        *pbVar21 = (byte)uVar8 | 0x80;
        uVar9 = uVar8 >> 7;
        pbVar21 = pbVar21 + 1;
        bVar6 = 0x3fff < uVar8;
        uVar8 = uVar9;
      } while (bVar6);
    }
    *pbVar21 = (byte)uVar9;
    target = ConvolutionParameter::InternalSerializeWithCachedSizesToArray
                       (this_03,false,pbVar21 + 1);
  }
  if ((uVar14 & 0x10) != 0) {
    this_04 = pVVar7->data_param_;
    *target = 0x5a;
    pbVar21 = target + 1;
    uVar8 = this_04->_cached_size_;
    uVar9 = uVar8;
    if (0x7f < uVar8) {
      do {
        *pbVar21 = (byte)uVar8 | 0x80;
        uVar9 = uVar8 >> 7;
        pbVar21 = pbVar21 + 1;
        bVar6 = 0x3fff < uVar8;
        uVar8 = uVar9;
      } while (bVar6);
    }
    *pbVar21 = (byte)uVar9;
    target = DataParameter::InternalSerializeWithCachedSizesToArray(this_04,false,pbVar21 + 1);
  }
  if ((uVar14 & 0x20) != 0) {
    this_05 = pVVar7->dropout_param_;
    *target = 0x62;
    pbVar21 = target + 1;
    uVar8 = this_05->_cached_size_;
    uVar9 = uVar8;
    if (0x7f < uVar8) {
      do {
        *pbVar21 = (byte)uVar8 | 0x80;
        uVar9 = uVar8 >> 7;
        pbVar21 = pbVar21 + 1;
        bVar6 = 0x3fff < uVar8;
        uVar8 = uVar9;
      } while (bVar6);
    }
    *pbVar21 = (byte)uVar9;
    target = DropoutParameter::InternalSerializeWithCachedSizesToArray(this_05,false,pbVar21 + 1);
  }
  if ((uVar14 & 0x40) != 0) {
    this_06 = pVVar7->hdf5_data_param_;
    *target = 0x6a;
    pbVar21 = target + 1;
    uVar8 = this_06->_cached_size_;
    uVar9 = uVar8;
    if (0x7f < uVar8) {
      do {
        *pbVar21 = (byte)uVar8 | 0x80;
        uVar9 = uVar8 >> 7;
        pbVar21 = pbVar21 + 1;
        bVar6 = 0x3fff < uVar8;
        uVar8 = uVar9;
      } while (bVar6);
    }
    *pbVar21 = (byte)uVar9;
    target = HDF5DataParameter::InternalSerializeWithCachedSizesToArray(this_06,false,pbVar21 + 1);
  }
  if ((char)uVar14 < '\0') {
    this_07 = pVVar7->hdf5_output_param_;
    *target = 0x72;
    pbVar21 = target + 1;
    uVar8 = this_07->_cached_size_;
    uVar9 = uVar8;
    if (0x7f < uVar8) {
      do {
        *pbVar21 = (byte)uVar8 | 0x80;
        uVar9 = uVar8 >> 7;
        pbVar21 = pbVar21 + 1;
        bVar6 = 0x3fff < uVar8;
        uVar8 = uVar9;
      } while (bVar6);
    }
    *pbVar21 = (byte)uVar9;
    target = HDF5OutputParameter::InternalSerializeWithCachedSizesToArray(this_07,false,pbVar21 + 1)
    ;
  }
  if ((uVar14 >> 8 & 1) != 0) {
    this_08 = pVVar7->image_data_param_;
    *target = 0x7a;
    pbVar21 = target + 1;
    uVar8 = this_08->_cached_size_;
    uVar9 = uVar8;
    if (0x7f < uVar8) {
      do {
        *pbVar21 = (byte)uVar8 | 0x80;
        uVar9 = uVar8 >> 7;
        pbVar21 = pbVar21 + 1;
        bVar6 = 0x3fff < uVar8;
        uVar8 = uVar9;
      } while (bVar6);
    }
    *pbVar21 = (byte)uVar9;
    target = ImageDataParameter::InternalSerializeWithCachedSizesToArray(this_08,false,pbVar21 + 1);
  }
  if ((uVar14 >> 9 & 1) != 0) {
    this_09 = pVVar7->infogain_loss_param_;
    target[0] = 0x82;
    target[1] = 1;
    pbVar21 = target + 2;
    uVar8 = this_09->_cached_size_;
    uVar9 = uVar8;
    if (0x7f < uVar8) {
      do {
        *pbVar21 = (byte)uVar8 | 0x80;
        uVar9 = uVar8 >> 7;
        pbVar21 = pbVar21 + 1;
        bVar6 = 0x3fff < uVar8;
        uVar8 = uVar9;
      } while (bVar6);
    }
    *pbVar21 = (byte)uVar9;
    target = InfogainLossParameter::InternalSerializeWithCachedSizesToArray
                       (this_09,false,pbVar21 + 1);
  }
  if ((uVar14 >> 10 & 1) != 0) {
    this_10 = pVVar7->inner_product_param_;
    target[0] = 0x8a;
    target[1] = 1;
    pbVar21 = target + 2;
    uVar8 = this_10->_cached_size_;
    uVar9 = uVar8;
    if (0x7f < uVar8) {
      do {
        *pbVar21 = (byte)uVar8 | 0x80;
        uVar9 = uVar8 >> 7;
        pbVar21 = pbVar21 + 1;
        bVar6 = 0x3fff < uVar8;
        uVar8 = uVar9;
      } while (bVar6);
    }
    *pbVar21 = (byte)uVar9;
    target = InnerProductParameter::InternalSerializeWithCachedSizesToArray
                       (this_10,false,pbVar21 + 1);
  }
  if ((uVar14 >> 0xb & 1) != 0) {
    this_11 = pVVar7->lrn_param_;
    target[0] = 0x92;
    target[1] = 1;
    pbVar21 = target + 2;
    uVar8 = this_11->_cached_size_;
    uVar9 = uVar8;
    if (0x7f < uVar8) {
      do {
        *pbVar21 = (byte)uVar8 | 0x80;
        uVar9 = uVar8 >> 7;
        pbVar21 = pbVar21 + 1;
        bVar6 = 0x3fff < uVar8;
        uVar8 = uVar9;
      } while (bVar6);
    }
    *pbVar21 = (byte)uVar9;
    target = LRNParameter::InternalSerializeWithCachedSizesToArray(this_11,false,pbVar21 + 1);
  }
  if ((uVar14 >> 0xc & 1) != 0) {
    this_12 = pVVar7->pooling_param_;
    target[0] = 0x9a;
    target[1] = 1;
    pbVar21 = target + 2;
    uVar8 = this_12->_cached_size_;
    uVar9 = uVar8;
    if (0x7f < uVar8) {
      do {
        *pbVar21 = (byte)uVar8 | 0x80;
        uVar9 = uVar8 >> 7;
        pbVar21 = pbVar21 + 1;
        bVar6 = 0x3fff < uVar8;
        uVar8 = uVar9;
      } while (bVar6);
    }
    *pbVar21 = (byte)uVar9;
    target = PoolingParameter::InternalSerializeWithCachedSizesToArray(this_12,false,pbVar21 + 1);
  }
  if ((uVar14 >> 0xd & 1) != 0) {
    this_13 = pVVar7->window_data_param_;
    target[0] = 0xa2;
    target[1] = 1;
    pbVar21 = target + 2;
    uVar8 = this_13->_cached_size_;
    uVar9 = uVar8;
    if (0x7f < uVar8) {
      do {
        *pbVar21 = (byte)uVar8 | 0x80;
        uVar9 = uVar8 >> 7;
        pbVar21 = pbVar21 + 1;
        bVar6 = 0x3fff < uVar8;
        uVar8 = uVar9;
      } while (bVar6);
    }
    *pbVar21 = (byte)uVar9;
    target = WindowDataParameter::InternalSerializeWithCachedSizesToArray(this_13,false,pbVar21 + 1)
    ;
  }
  if ((uVar14 >> 0xe & 1) != 0) {
    this_14 = pVVar7->power_param_;
    target[0] = 0xaa;
    target[1] = 1;
    pbVar21 = target + 2;
    uVar8 = this_14->_cached_size_;
    uVar9 = uVar8;
    if (0x7f < uVar8) {
      do {
        *pbVar21 = (byte)uVar8 | 0x80;
        uVar9 = uVar8 >> 7;
        pbVar21 = pbVar21 + 1;
        bVar6 = 0x3fff < uVar8;
        uVar8 = uVar9;
      } while (bVar6);
    }
    *pbVar21 = (byte)uVar9;
    target = PowerParameter::InternalSerializeWithCachedSizesToArray(this_14,false,pbVar21 + 1);
  }
  if ((short)uVar14 < 0) {
    this_15 = pVVar7->memory_data_param_;
    target[0] = 0xb2;
    target[1] = 1;
    pbVar21 = target + 2;
    uVar8 = this_15->_cached_size_;
    uVar9 = uVar8;
    if (0x7f < uVar8) {
      do {
        *pbVar21 = (byte)uVar8 | 0x80;
        uVar9 = uVar8 >> 7;
        pbVar21 = pbVar21 + 1;
        bVar6 = 0x3fff < uVar8;
        uVar8 = uVar9;
      } while (bVar6);
    }
    *pbVar21 = (byte)uVar9;
    target = MemoryDataParameter::InternalSerializeWithCachedSizesToArray(this_15,false,pbVar21 + 1)
    ;
  }
  if ((uVar14 >> 0x10 & 1) != 0) {
    this_16 = pVVar7->argmax_param_;
    target[0] = 0xba;
    target[1] = 1;
    pbVar21 = target + 2;
    uVar8 = this_16->_cached_size_;
    uVar9 = uVar8;
    if (0x7f < uVar8) {
      do {
        *pbVar21 = (byte)uVar8 | 0x80;
        uVar9 = uVar8 >> 7;
        pbVar21 = pbVar21 + 1;
        bVar6 = 0x3fff < uVar8;
        uVar8 = uVar9;
      } while (bVar6);
    }
    *pbVar21 = (byte)uVar9;
    target = ArgMaxParameter::InternalSerializeWithCachedSizesToArray(this_16,false,pbVar21 + 1);
  }
  if ((uVar14 >> 0x11 & 1) != 0) {
    this_17 = pVVar7->eltwise_param_;
    target[0] = 0xc2;
    target[1] = 1;
    pbVar21 = target + 2;
    uVar8 = this_17->_cached_size_;
    uVar9 = uVar8;
    if (0x7f < uVar8) {
      do {
        *pbVar21 = (byte)uVar8 | 0x80;
        uVar9 = uVar8 >> 7;
        pbVar21 = pbVar21 + 1;
        bVar6 = 0x3fff < uVar8;
        uVar8 = uVar9;
      } while (bVar6);
    }
    *pbVar21 = (byte)uVar9;
    target = EltwiseParameter::InternalSerializeWithCachedSizesToArray(this_17,false,pbVar21 + 1);
  }
  if ((uVar14 >> 0x12 & 1) != 0) {
    this_18 = pVVar7->threshold_param_;
    target[0] = 0xca;
    target[1] = 1;
    pbVar21 = target + 2;
    uVar8 = this_18->_cached_size_;
    uVar9 = uVar8;
    if (0x7f < uVar8) {
      do {
        *pbVar21 = (byte)uVar8 | 0x80;
        uVar9 = uVar8 >> 7;
        pbVar21 = pbVar21 + 1;
        bVar6 = 0x3fff < uVar8;
        uVar8 = uVar9;
      } while (bVar6);
    }
    *pbVar21 = (byte)uVar9;
    target = ThresholdParameter::InternalSerializeWithCachedSizesToArray(this_18,false,pbVar21 + 1);
  }
  if ((uVar14 >> 0x13 & 1) != 0) {
    this_19 = pVVar7->dummy_data_param_;
    target[0] = 0xd2;
    target[1] = 1;
    pbVar21 = target + 2;
    uVar8 = this_19->_cached_size_;
    uVar9 = uVar8;
    if (0x7f < uVar8) {
      do {
        *pbVar21 = (byte)uVar8 | 0x80;
        uVar9 = uVar8 >> 7;
        pbVar21 = pbVar21 + 1;
        bVar6 = 0x3fff < uVar8;
        uVar8 = uVar9;
      } while (bVar6);
    }
    *pbVar21 = (byte)uVar9;
    target = DummyDataParameter::InternalSerializeWithCachedSizesToArray(this_19,false,pbVar21 + 1);
  }
  if ((uVar14 >> 0x14 & 1) != 0) {
    this_20 = pVVar7->accuracy_param_;
    target[0] = 0xda;
    target[1] = 1;
    pbVar21 = target + 2;
    uVar8 = this_20->_cached_size_;
    uVar9 = uVar8;
    if (0x7f < uVar8) {
      do {
        *pbVar21 = (byte)uVar8 | 0x80;
        uVar9 = uVar8 >> 7;
        pbVar21 = pbVar21 + 1;
        bVar6 = 0x3fff < uVar8;
        uVar8 = uVar9;
      } while (bVar6);
    }
    *pbVar21 = (byte)uVar9;
    target = AccuracyParameter::InternalSerializeWithCachedSizesToArray(this_20,false,pbVar21 + 1);
  }
  if ((uVar14 >> 0x15 & 1) != 0) {
    this_21 = pVVar7->hinge_loss_param_;
    target[0] = 0xea;
    target[1] = 1;
    pbVar21 = target + 2;
    uVar8 = this_21->_cached_size_;
    uVar9 = uVar8;
    if (0x7f < uVar8) {
      do {
        *pbVar21 = (byte)uVar8 | 0x80;
        uVar9 = uVar8 >> 7;
        pbVar21 = pbVar21 + 1;
        bVar6 = 0x3fff < uVar8;
        uVar8 = uVar9;
      } while (bVar6);
    }
    *pbVar21 = (byte)uVar9;
    target = HingeLossParameter::InternalSerializeWithCachedSizesToArray(this_21,false,pbVar21 + 1);
  }
  if ((uVar14 >> 0x16 & 1) != 0) {
    this_22 = pVVar7->relu_param_;
    target[0] = 0xf2;
    target[1] = 1;
    pbVar21 = target + 2;
    uVar8 = this_22->_cached_size_;
    uVar9 = uVar8;
    if (0x7f < uVar8) {
      do {
        *pbVar21 = (byte)uVar8 | 0x80;
        uVar9 = uVar8 >> 7;
        pbVar21 = pbVar21 + 1;
        bVar6 = 0x3fff < uVar8;
        uVar8 = uVar9;
      } while (bVar6);
    }
    *pbVar21 = (byte)uVar9;
    target = ReLUParameter::InternalSerializeWithCachedSizesToArray(this_22,false,pbVar21 + 1);
  }
  if ((uVar14 >> 0x17 & 1) != 0) {
    this_23 = pVVar7->slice_param_;
    target[0] = 0xfa;
    target[1] = 1;
    pbVar21 = target + 2;
    uVar8 = this_23->_cached_size_;
    uVar9 = uVar8;
    if (0x7f < uVar8) {
      do {
        *pbVar21 = (byte)uVar8 | 0x80;
        uVar9 = uVar8 >> 7;
        pbVar21 = pbVar21 + 1;
        bVar6 = 0x3fff < uVar8;
        uVar8 = uVar9;
      } while (bVar6);
    }
    *pbVar21 = (byte)uVar9;
    target = SliceParameter::InternalSerializeWithCachedSizesToArray(this_23,false,pbVar21 + 1);
  }
  iVar2 = (pVVar7->include_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar2 != 0) {
    iVar18 = 0;
    do {
      pTVar12 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<caffe::NetStateRule>::TypeHandler>
                          (&(pVVar7->include_).super_RepeatedPtrFieldBase,iVar18);
      target[0] = 0x82;
      target[1] = 2;
      pbVar21 = target + 2;
      uVar8 = pTVar12->_cached_size_;
      uVar9 = uVar8;
      if (0x7f < uVar8) {
        do {
          *pbVar21 = (byte)uVar8 | 0x80;
          uVar9 = uVar8 >> 7;
          pbVar21 = pbVar21 + 1;
          bVar6 = 0x3fff < uVar8;
          uVar8 = uVar9;
        } while (bVar6);
      }
      *pbVar21 = (byte)uVar9;
      target = NetStateRule::InternalSerializeWithCachedSizesToArray(pTVar12,false,pbVar21 + 1);
      iVar18 = iVar18 + 1;
    } while (iVar18 != iVar2);
  }
  iVar2 = (local_78->exclude_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar2 != 0) {
    this_00 = &local_78->exclude_;
    iVar18 = 0;
    do {
      pTVar12 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<caffe::NetStateRule>::TypeHandler>
                          (&this_00->super_RepeatedPtrFieldBase,iVar18);
      target[0] = 0x8a;
      target[1] = 2;
      pbVar21 = target + 2;
      uVar8 = pTVar12->_cached_size_;
      uVar9 = uVar8;
      if (0x7f < uVar8) {
        do {
          *pbVar21 = (byte)uVar8 | 0x80;
          uVar9 = uVar8 >> 7;
          pbVar21 = pbVar21 + 1;
          bVar6 = 0x3fff < uVar8;
          uVar8 = uVar9;
        } while (bVar6);
      }
      *pbVar21 = (byte)uVar9;
      target = NetStateRule::InternalSerializeWithCachedSizesToArray(pTVar12,false,pbVar21 + 1);
      iVar18 = iVar18 + 1;
    } while (iVar18 != iVar2);
  }
  pVVar7 = local_78;
  if ((uVar14 >> 0x18 & 1) != 0) {
    this_24 = local_78->mvn_param_;
    target[0] = 0x92;
    target[1] = 2;
    pbVar21 = target + 2;
    uVar8 = this_24->_cached_size_;
    uVar9 = uVar8;
    if (0x7f < uVar8) {
      do {
        *pbVar21 = (byte)uVar8 | 0x80;
        uVar9 = uVar8 >> 7;
        pbVar21 = pbVar21 + 1;
        bVar6 = 0x3fff < uVar8;
        uVar8 = uVar9;
      } while (bVar6);
    }
    *pbVar21 = (byte)uVar9;
    target = MVNParameter::InternalSerializeWithCachedSizesToArray(this_24,false,pbVar21 + 1);
  }
  uVar8 = (pVVar7->loss_weight_).current_size_;
  if (uVar8 != 0) {
    pRVar13 = (pVVar7->loss_weight_).rep_;
    if (pRVar13 == (Rep *)0x0) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x4e2);
      pLVar11 = google::protobuf::internal::LogMessage::operator<<(&local_68,"CHECK failed: rep_: ")
      ;
      google::protobuf::internal::LogFinisher::operator=(&local_79,pLVar11);
      google::protobuf::internal::LogMessage::~LogMessage(&local_68);
      pRVar13 = (pVVar7->loss_weight_).rep_;
    }
    uVar15 = 1;
    if (1 < (int)uVar8) {
      uVar15 = (ulong)uVar8;
    }
    uVar17 = 0;
    do {
      fVar1 = pRVar13->elements[uVar17];
      target[0] = 0x9d;
      target[1] = 2;
      *(float *)(target + 2) = fVar1;
      target = target + 6;
      uVar17 = uVar17 + 1;
    } while (uVar15 != uVar17);
  }
  if ((uVar14 >> 0x19 & 1) != 0) {
    this_25 = pVVar7->transform_param_;
    target[0] = 0xa2;
    target[1] = 2;
    pbVar21 = target + 2;
    uVar8 = this_25->_cached_size_;
    uVar9 = uVar8;
    if (0x7f < uVar8) {
      do {
        *pbVar21 = (byte)uVar8 | 0x80;
        uVar9 = uVar8 >> 7;
        pbVar21 = pbVar21 + 1;
        bVar6 = 0x3fff < uVar8;
        uVar8 = uVar9;
      } while (bVar6);
    }
    *pbVar21 = (byte)uVar9;
    target = TransformationParameter::InternalSerializeWithCachedSizesToArray
                       (this_25,false,pbVar21 + 1);
  }
  if ((uVar14 >> 0x1a & 1) != 0) {
    this_26 = pVVar7->tanh_param_;
    target[0] = 0xaa;
    target[1] = 2;
    pbVar21 = target + 2;
    uVar8 = this_26->_cached_size_;
    uVar9 = uVar8;
    if (0x7f < uVar8) {
      do {
        *pbVar21 = (byte)uVar8 | 0x80;
        uVar9 = uVar8 >> 7;
        pbVar21 = pbVar21 + 1;
        bVar6 = 0x3fff < uVar8;
        uVar8 = uVar9;
      } while (bVar6);
    }
    *pbVar21 = (byte)uVar9;
    target = TanHParameter::InternalSerializeWithCachedSizesToArray(this_26,false,pbVar21 + 1);
  }
  if ((uVar14 >> 0x1b & 1) != 0) {
    this_27 = pVVar7->sigmoid_param_;
    target[0] = 0xb2;
    target[1] = 2;
    pbVar21 = target + 2;
    uVar8 = this_27->_cached_size_;
    uVar9 = uVar8;
    if (0x7f < uVar8) {
      do {
        *pbVar21 = (byte)uVar8 | 0x80;
        uVar9 = uVar8 >> 7;
        pbVar21 = pbVar21 + 1;
        bVar6 = 0x3fff < uVar8;
        uVar8 = uVar9;
      } while (bVar6);
    }
    *pbVar21 = (byte)uVar9;
    target = SigmoidParameter::InternalSerializeWithCachedSizesToArray(this_27,false,pbVar21 + 1);
  }
  if ((uVar14 >> 0x1c & 1) != 0) {
    this_28 = pVVar7->softmax_param_;
    target[0] = 0xba;
    target[1] = 2;
    pbVar21 = target + 2;
    uVar8 = this_28->_cached_size_;
    uVar9 = uVar8;
    if (0x7f < uVar8) {
      do {
        *pbVar21 = (byte)uVar8 | 0x80;
        uVar9 = uVar8 >> 7;
        pbVar21 = pbVar21 + 1;
        bVar6 = 0x3fff < uVar8;
        uVar8 = uVar9;
      } while (bVar6);
    }
    *pbVar21 = (byte)uVar9;
    target = SoftmaxParameter::InternalSerializeWithCachedSizesToArray(this_28,false,pbVar21 + 1);
  }
  if ((uVar14 >> 0x1d & 1) != 0) {
    this_29 = pVVar7->contrastive_loss_param_;
    target[0] = 0xc2;
    target[1] = 2;
    pbVar21 = target + 2;
    uVar8 = this_29->_cached_size_;
    uVar9 = uVar8;
    if (0x7f < uVar8) {
      do {
        *pbVar21 = (byte)uVar8 | 0x80;
        uVar9 = uVar8 >> 7;
        pbVar21 = pbVar21 + 1;
        bVar6 = 0x3fff < uVar8;
        uVar8 = uVar9;
      } while (bVar6);
    }
    *pbVar21 = (byte)uVar9;
    target = ContrastiveLossParameter::InternalSerializeWithCachedSizesToArray
                       (this_29,false,pbVar21 + 1);
  }
  if ((uVar14 >> 0x1e & 1) != 0) {
    this_30 = pVVar7->exp_param_;
    target[0] = 0xca;
    target[1] = 2;
    pbVar21 = target + 2;
    uVar8 = this_30->_cached_size_;
    uVar9 = uVar8;
    if (0x7f < uVar8) {
      do {
        *pbVar21 = (byte)uVar8 | 0x80;
        uVar9 = uVar8 >> 7;
        pbVar21 = pbVar21 + 1;
        bVar6 = 0x3fff < uVar8;
        uVar8 = uVar9;
      } while (bVar6);
    }
    *pbVar21 = (byte)uVar9;
    target = ExpParameter::InternalSerializeWithCachedSizesToArray(this_30,false,pbVar21 + 1);
  }
  if ((int)uVar14 < 0) {
    this_31 = pVVar7->loss_param_;
    target[0] = 0xd2;
    target[1] = 2;
    pbVar21 = target + 2;
    uVar14 = this_31->_cached_size_;
    uVar8 = uVar14;
    if (0x7f < uVar14) {
      do {
        *pbVar21 = (byte)uVar14 | 0x80;
        uVar8 = uVar14 >> 7;
        pbVar21 = pbVar21 + 1;
        bVar6 = 0x3fff < uVar14;
        uVar14 = uVar8;
      } while (bVar6);
    }
    *pbVar21 = (byte)uVar8;
    target = LossParameter::InternalSerializeWithCachedSizesToArray(this_31,false,pbVar21 + 1);
  }
  iVar2 = (pVVar7->param_).super_RepeatedPtrFieldBase.current_size_;
  if (0 < iVar2) {
    pRVar22 = &pVVar7->param_;
    iVar18 = 0;
    do {
      pTVar10 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                          (&pRVar22->super_RepeatedPtrFieldBase,iVar18);
      pcVar3 = (pTVar10->_M_dataplus)._M_p;
      pTVar10 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                          (&pRVar22->super_RepeatedPtrFieldBase,iVar18);
      google::protobuf::internal::WireFormatLite::VerifyUtf8String
                (pcVar3,(int)pTVar10->_M_string_length,SERIALIZE,"caffe.V1LayerParameter.param");
      pTVar10 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                          (&pRVar22->super_RepeatedPtrFieldBase,iVar18);
      target[0] = 0xca;
      target[1] = 0x3e;
      target = google::protobuf::io::CodedOutputStream::WriteStringWithSizeToArray
                         (pTVar10,target + 2);
      iVar18 = iVar18 + 1;
    } while (iVar2 != iVar18);
  }
  pVVar7 = local_78;
  uVar14 = (local_78->blob_share_mode_).current_size_;
  if (uVar14 != 0) {
    pRVar16 = (local_78->blob_share_mode_).rep_;
    if (pRVar16 == (Rep *)0x0) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x4e2);
      pLVar11 = google::protobuf::internal::LogMessage::operator<<(&local_68,"CHECK failed: rep_: ")
      ;
      google::protobuf::internal::LogFinisher::operator=(&local_79,pLVar11);
      google::protobuf::internal::LogMessage::~LogMessage(&local_68);
      pRVar16 = (pVVar7->blob_share_mode_).rep_;
    }
    uVar15 = 1;
    if (1 < (int)uVar14) {
      uVar15 = (ulong)uVar14;
    }
    uVar17 = 0;
    do {
      uVar19 = (ulong)pRVar16->elements[uVar17];
      pbVar21 = target + 2;
      target[0] = 0xd0;
      target[1] = 0x3e;
      uVar20 = uVar19;
      if (0x7f < uVar19) {
        do {
          *pbVar21 = (byte)uVar19 | 0x80;
          uVar20 = uVar19 >> 7;
          pbVar21 = pbVar21 + 1;
          bVar6 = 0x3fff < uVar19;
          uVar19 = uVar20;
        } while (bVar6);
      }
      *pbVar21 = (byte)uVar20;
      target = pbVar21 + 1;
      uVar17 = uVar17 + 1;
    } while (uVar17 != uVar15);
  }
  pvVar5 = (pVVar7->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar5 & 1) != 0) {
    target = google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((ulong)pvVar5 & 0xfffffffffffffffe),target);
  }
  return target;
}

Assistant:

::google::protobuf::uint8* V1LayerParameter::InternalSerializeWithCachedSizesToArray(
    bool deterministic, ::google::protobuf::uint8* target) const {
  // @@protoc_insertion_point(serialize_to_array_start:caffe.V1LayerParameter)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional .caffe.V0LayerParameter layer = 1;
  if (cached_has_bits & 0x00000002u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        1, *this->layer_, deterministic, target);
  }

  // repeated string bottom = 2;
  for (int i = 0, n = this->bottom_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->bottom(i).data(), this->bottom(i).length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.V1LayerParameter.bottom");
    target = ::google::protobuf::internal::WireFormatLite::
      WriteStringToArray(2, this->bottom(i), target);
  }

  // repeated string top = 3;
  for (int i = 0, n = this->top_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->top(i).data(), this->top(i).length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.V1LayerParameter.top");
    target = ::google::protobuf::internal::WireFormatLite::
      WriteStringToArray(3, this->top(i), target);
  }

  // optional string name = 4;
  if (cached_has_bits & 0x00000001u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->name().data(), this->name().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.V1LayerParameter.name");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        4, this->name(), target);
  }

  cached_has_bits = _has_bits_[1];
  // optional .caffe.V1LayerParameter.LayerType type = 5;
  if (cached_has_bits & 0x00000001u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteEnumToArray(
      5, this->type(), target);
  }

  // repeated .caffe.BlobProto blobs = 6;
  for (unsigned int i = 0, n = this->blobs_size(); i < n; i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        6, this->blobs(i), deterministic, target);
  }

  // repeated float blobs_lr = 7;
  target = ::google::protobuf::internal::WireFormatLite::
    WriteFloatToArray(7, this->blobs_lr_, target);

  // repeated float weight_decay = 8;
  target = ::google::protobuf::internal::WireFormatLite::
    WriteFloatToArray(8, this->weight_decay_, target);

  cached_has_bits = _has_bits_[0];
  // optional .caffe.ConcatParameter concat_param = 9;
  if (cached_has_bits & 0x00000004u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        9, *this->concat_param_, deterministic, target);
  }

  // optional .caffe.ConvolutionParameter convolution_param = 10;
  if (cached_has_bits & 0x00000008u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        10, *this->convolution_param_, deterministic, target);
  }

  // optional .caffe.DataParameter data_param = 11;
  if (cached_has_bits & 0x00000010u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        11, *this->data_param_, deterministic, target);
  }

  // optional .caffe.DropoutParameter dropout_param = 12;
  if (cached_has_bits & 0x00000020u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        12, *this->dropout_param_, deterministic, target);
  }

  // optional .caffe.HDF5DataParameter hdf5_data_param = 13;
  if (cached_has_bits & 0x00000040u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        13, *this->hdf5_data_param_, deterministic, target);
  }

  // optional .caffe.HDF5OutputParameter hdf5_output_param = 14;
  if (cached_has_bits & 0x00000080u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        14, *this->hdf5_output_param_, deterministic, target);
  }

  // optional .caffe.ImageDataParameter image_data_param = 15;
  if (cached_has_bits & 0x00000100u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        15, *this->image_data_param_, deterministic, target);
  }

  // optional .caffe.InfogainLossParameter infogain_loss_param = 16;
  if (cached_has_bits & 0x00000200u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        16, *this->infogain_loss_param_, deterministic, target);
  }

  // optional .caffe.InnerProductParameter inner_product_param = 17;
  if (cached_has_bits & 0x00000400u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        17, *this->inner_product_param_, deterministic, target);
  }

  // optional .caffe.LRNParameter lrn_param = 18;
  if (cached_has_bits & 0x00000800u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        18, *this->lrn_param_, deterministic, target);
  }

  // optional .caffe.PoolingParameter pooling_param = 19;
  if (cached_has_bits & 0x00001000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        19, *this->pooling_param_, deterministic, target);
  }

  // optional .caffe.WindowDataParameter window_data_param = 20;
  if (cached_has_bits & 0x00002000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        20, *this->window_data_param_, deterministic, target);
  }

  // optional .caffe.PowerParameter power_param = 21;
  if (cached_has_bits & 0x00004000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        21, *this->power_param_, deterministic, target);
  }

  // optional .caffe.MemoryDataParameter memory_data_param = 22;
  if (cached_has_bits & 0x00008000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        22, *this->memory_data_param_, deterministic, target);
  }

  // optional .caffe.ArgMaxParameter argmax_param = 23;
  if (cached_has_bits & 0x00010000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        23, *this->argmax_param_, deterministic, target);
  }

  // optional .caffe.EltwiseParameter eltwise_param = 24;
  if (cached_has_bits & 0x00020000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        24, *this->eltwise_param_, deterministic, target);
  }

  // optional .caffe.ThresholdParameter threshold_param = 25;
  if (cached_has_bits & 0x00040000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        25, *this->threshold_param_, deterministic, target);
  }

  // optional .caffe.DummyDataParameter dummy_data_param = 26;
  if (cached_has_bits & 0x00080000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        26, *this->dummy_data_param_, deterministic, target);
  }

  // optional .caffe.AccuracyParameter accuracy_param = 27;
  if (cached_has_bits & 0x00100000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        27, *this->accuracy_param_, deterministic, target);
  }

  // optional .caffe.HingeLossParameter hinge_loss_param = 29;
  if (cached_has_bits & 0x00200000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        29, *this->hinge_loss_param_, deterministic, target);
  }

  // optional .caffe.ReLUParameter relu_param = 30;
  if (cached_has_bits & 0x00400000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        30, *this->relu_param_, deterministic, target);
  }

  // optional .caffe.SliceParameter slice_param = 31;
  if (cached_has_bits & 0x00800000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        31, *this->slice_param_, deterministic, target);
  }

  // repeated .caffe.NetStateRule include = 32;
  for (unsigned int i = 0, n = this->include_size(); i < n; i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        32, this->include(i), deterministic, target);
  }

  // repeated .caffe.NetStateRule exclude = 33;
  for (unsigned int i = 0, n = this->exclude_size(); i < n; i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        33, this->exclude(i), deterministic, target);
  }

  // optional .caffe.MVNParameter mvn_param = 34;
  if (cached_has_bits & 0x01000000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        34, *this->mvn_param_, deterministic, target);
  }

  // repeated float loss_weight = 35;
  target = ::google::protobuf::internal::WireFormatLite::
    WriteFloatToArray(35, this->loss_weight_, target);

  // optional .caffe.TransformationParameter transform_param = 36;
  if (cached_has_bits & 0x02000000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        36, *this->transform_param_, deterministic, target);
  }

  // optional .caffe.TanHParameter tanh_param = 37;
  if (cached_has_bits & 0x04000000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        37, *this->tanh_param_, deterministic, target);
  }

  // optional .caffe.SigmoidParameter sigmoid_param = 38;
  if (cached_has_bits & 0x08000000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        38, *this->sigmoid_param_, deterministic, target);
  }

  // optional .caffe.SoftmaxParameter softmax_param = 39;
  if (cached_has_bits & 0x10000000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        39, *this->softmax_param_, deterministic, target);
  }

  // optional .caffe.ContrastiveLossParameter contrastive_loss_param = 40;
  if (cached_has_bits & 0x20000000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        40, *this->contrastive_loss_param_, deterministic, target);
  }

  // optional .caffe.ExpParameter exp_param = 41;
  if (cached_has_bits & 0x40000000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        41, *this->exp_param_, deterministic, target);
  }

  // optional .caffe.LossParameter loss_param = 42;
  if (cached_has_bits & 0x80000000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        42, *this->loss_param_, deterministic, target);
  }

  // repeated string param = 1001;
  for (int i = 0, n = this->param_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->param(i).data(), this->param(i).length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.V1LayerParameter.param");
    target = ::google::protobuf::internal::WireFormatLite::
      WriteStringToArray(1001, this->param(i), target);
  }

  // repeated .caffe.V1LayerParameter.DimCheckMode blob_share_mode = 1002;
  target = ::google::protobuf::internal::WireFormatLite::WriteEnumToArray(
    1002, this->blob_share_mode_, target);

  if (_internal_metadata_.have_unknown_fields()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:caffe.V1LayerParameter)
  return target;
}